

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O0

bool __thiscall
libDAI::NDP::VariableHasLowerDegree::operator()(VariableHasLowerDegree *this,Var i,Var j)

{
  long *plVar1;
  nb_type *pnVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 *in_RDI;
  size_t dj;
  size_t di;
  size_t ind_j;
  size_t ind_i;
  FactorGraph *g;
  size_t in_stack_ffffffffffffffa8;
  FactorGraph *in_stack_ffffffffffffffb0;
  undefined1 local_20 [16];
  undefined1 local_10 [16];
  
  plVar1 = (long *)*in_RDI;
  (**(code **)(*plVar1 + 0x40))(plVar1,local_10);
  (**(code **)(*plVar1 + 0x40))(plVar1,local_20);
  pnVar2 = FactorGraph::nbV(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pnVar2);
  pnVar2 = FactorGraph::nbV(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pnVar2);
  return sVar3 < sVar4;
}

Assistant:

bool operator()  (Var i, Var j) const
                { 
                    const FactorGraph& g = _m_grm;
                    size_t ind_i =  g.findVar(i);
                    size_t ind_j =  g.findVar(j);
                    size_t di = g.nbV(ind_i).size();
                    size_t dj = g.nbV(ind_j).size();
                    return (di<dj); 
                }